

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O2

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<1>_>
::Container::Container(Container *this,int d,NLBaseReif<1> *c)

{
  NLBaseReif<1> local_40;
  
  NLBaseReif<1>::NLBaseReif(&local_40,c);
  NLBaseReif<1>::NLBaseReif((NLBaseReif<1> *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  this->depth_ = d;
  (this->ctx_redef_).value_ = CTX_NONE;
  *(undefined4 *)((long)&(this->ctx_redef_).value_ + 3) = 0;
  return;
}

Assistant:

Container(int d, Constraint&& c) noexcept
      : con_(std::move(c)), depth_(d) { }